

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  ~IfcRelAggregates(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}